

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O1

void UI::interactive_mode(void)

{
  string local_50;
  string local_30;
  
  print_welcome();
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,
             " Katana can be quickly run with input arguments or be run interactively.","");
  print_ln(&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50," Katana is currently running in interactive mode.","");
  print_ln(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  skip_ln();
  main_menu();
  return;
}

Assistant:

void UI::interactive_mode()
{
    print_welcome();
    print_ln(" Katana can be quickly run with input arguments or be run interactively.");
    print_ln(" Katana is currently running in interactive mode.");
    skip_ln();
    main_menu();
}